

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_dist.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,param_type *P)

{
  long lVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  _Setprecision _Var3;
  ostream *poVar4;
  param_type *in_RSI;
  ostream *in_RDI;
  result_type_conflict2 rVar5;
  fmtflags flags;
  
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  lVar1 = *(long *)(*(long *)in_RDI + -0x18);
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)(in_RDI + lVar1),_Var2);
  poVar4 = std::operator<<(in_RDI,'(');
  _Var3 = Catch::clara::std::setprecision(0x10);
  poVar4 = std::operator<<(poVar4,_Var3);
  rVar5 = normal_dist<double>::param_type::mu(in_RSI);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar5);
  poVar4 = std::operator<<(poVar4,' ');
  rVar5 = normal_dist<double>::param_type::sigma(in_RSI);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar5);
  std::operator<<(poVar4,')');
  Catch::clara::std::ios_base::flags
            ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)),__fmtfl);
  return (basic_ostream<char,_std::char_traits<char>_> *)in_RDI;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
          std::basic_ostream<char_t, traits_t> &out, const param_type &P) {
        std::ios_base::fmtflags flags(out.flags());
        out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        out << '(' << std::setprecision(math::numeric_limits<float_t>::digits10 + 1) << P.mu()
            << ' ' << P.sigma() << ')';
        out.flags(flags);
        return out;
      }